

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.h
# Opt level: O3

int __thiscall
soplex::SPxHarrisRT<double>::clone
          (SPxHarrisRT<double> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  char *pcVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x38);
  pcVar1 = (this->super_SPxRatioTester<double>).m_name;
  puVar2[1] = (this->super_SPxRatioTester<double>).thesolver;
  puVar2[2] = pcVar1;
  *(Type *)(puVar2 + 3) = (this->super_SPxRatioTester<double>).m_type;
  puVar2[4] = (this->super_SPxRatioTester<double>).delta;
  puVar2[5] = 0;
  puVar2[6] = 0;
  *puVar2 = &PTR_getName_003b1800;
  return (int)puVar2;
}

Assistant:

inline virtual SPxRatioTester<R>* clone() const
   {
      return new SPxHarrisRT(*this);
   }